

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::AddPropagateStatistics::Operation<long,duckdb::TryDecimalAdd>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Value local_70;
  
  lVar1 = NumericStats::GetMin<long>(lstats);
  lVar2 = NumericStats::GetMin<long>(rstats);
  if (lVar2 < 0) {
    if (lVar1 < -999999999999999999 - lVar2) {
      return true;
    }
  }
  else if (999999999999999999 - lVar2 < lVar1) {
    return true;
  }
  lVar3 = NumericStats::GetMax<long>(lstats);
  lVar4 = NumericStats::GetMax<long>(rstats);
  if (lVar4 < 0) {
    if (lVar3 < -999999999999999999 - lVar4) {
      return true;
    }
  }
  else if (999999999999999999 - lVar4 < lVar3) {
    return true;
  }
  Value::Numeric(&local_70,type,lVar2 + lVar1);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,lVar4 + lVar3);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}